

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O2

D_Sym * next_D_Sym_in_Scope(D_Scope **scope,D_Sym **sym)

{
  D_SymHash *pDVar1;
  D_Scope *pDVar2;
  D_Sym **ppDVar3;
  D_Sym *pDVar4;
  D_Sym *pDVar5;
  ulong uVar6;
  D_Scope *pDVar7;
  D_Sym *pDVar8;
  
  pDVar4 = *sym;
  pDVar7 = *scope;
  if ((pDVar4 == (D_Sym *)0x0) || (pDVar8 = pDVar4->next, pDVar8 == (D_Sym *)0x0)) {
    pDVar5 = (D_Sym *)0x0;
    pDVar2 = pDVar7;
    while (pDVar7 = pDVar2, pDVar7 != (D_Scope *)0x0) {
      pDVar1 = pDVar7->hash;
      if (pDVar1 == (D_SymHash *)0x0) {
        if (pDVar4 == (D_Sym *)0x0) {
          ppDVar3 = &pDVar7->ll;
          goto LAB_0012c6d5;
        }
      }
      else {
        if (pDVar4 == (D_Sym *)0x0) {
          uVar6 = 0;
        }
        else {
          uVar6 = (ulong)(pDVar4->hash + 1) % (ulong)(pDVar1->syms).n;
          if ((int)uVar6 == 0) goto LAB_0012c6dd;
        }
        ppDVar3 = (pDVar1->syms).v + uVar6;
LAB_0012c6d5:
        pDVar8 = *ppDVar3;
        if (pDVar8 != (D_Sym *)0x0) goto LAB_0012c68d;
      }
LAB_0012c6dd:
      pDVar2 = pDVar7->search;
      if ((pDVar2 == (D_Scope *)0x0) || (pDVar4 = (D_Sym *)0x0, pDVar2->up != pDVar7->up))
      goto LAB_0012c6fa;
    }
    pDVar7 = (D_Scope *)0x0;
    pDVar5 = (D_Sym *)0x0;
  }
  else {
LAB_0012c68d:
    *sym = pDVar8;
    pDVar5 = pDVar8;
  }
LAB_0012c6fa:
  *scope = pDVar7;
  return pDVar5;
}

Assistant:

D_Sym *next_D_Sym_in_Scope(D_Scope **scope, D_Sym **sym) {
  D_Sym *last_sym = *sym, *ll = last_sym;
  D_Scope *st = *scope;
  if (ll) {
    ll = ll->next;
    if (ll) goto Lreturn;
  }
  for (; st; st = st->search) {
    if (st->hash) {
      uint i = last_sym ? ((last_sym->hash + 1) % st->hash->syms.n) : 0;
      if (!last_sym || i) ll = st->hash->syms.v[i];
    } else {
      if (!last_sym) ll = st->ll;
    }
    last_sym = 0;
    if (ll) goto Lreturn;
    if (!st->search || st->search->up != st->up) break;
  }
Lreturn:
  if (ll) *sym = ll;
  *scope = st;
  return ll;
}